

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

size_t __thiscall
andres::
BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_int,_andres::marray_detail::Times<int,_short,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
::dimension(BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_int,_andres::marray_detail::Times<int,_short,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
            *this)

{
  ulong uVar1;
  size_t sVar2;
  runtime_error *this_00;
  
  sVar2 = BinaryViewExpressionScalarFirst<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_int,_andres::marray_detail::Times<int,_short,_int>_>
          ::dimension(this->e1_);
  if (this->e2_->data_ == (pointer)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar1 = (this->e2_->geometry_).dimension_;
  if (sVar2 < uVar1) {
    return uVar1;
  }
  sVar2 = BinaryViewExpressionScalarFirst<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_int,_andres::marray_detail::Times<int,_short,_int>_>
          ::dimension(this->e1_);
  return sVar2;
}

Assistant:

const std::size_t dimension() const 
        { return e1_.dimension() < e2_.dimension() ? e2_.dimension() : e1_.dimension(); }